

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_196f0::IDLTypeIdentifierVisitor::visit_
          (IDLTypeIdentifierVisitor *this,Container *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  first_finderF<const_char_*,_boost::algorithm::is_equal> Finder;
  first_finderF<const_char_*,_boost::algorithm::is_equal> Finder_00;
  iterator_range<const_char_*> FormatResult;
  iterator_range<const_char_*> FormatResult_00;
  int iVar4;
  Type *type_00;
  long *plVar5;
  input_iterator_type OuterIt;
  _Alloc_hider _Var6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  long *plVar8;
  size_type sVar9;
  size_type sVar10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var11;
  bool bVar12;
  const_formatF<boost::iterator_range<const_char_*>_> Formatter;
  const_formatF<boost::iterator_range<const_char_*>_> Formatter_00;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FindResult;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FindResult_00;
  string element_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string container_kind;
  string local_f0;
  long *local_d0;
  char *pcStack_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  char *pcStack_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  Typelib::Type::getName_abi_cxx11_();
  iVar4 = std::__cxx11::string::compare((char *)&local_70);
  paVar2 = &local_70.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.first._M_dataplus._M_p);
  }
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_namespace,0,(char *)(this->m_namespace)._M_string_length,0x118426);
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_front,0,(char *)(this->m_front)._M_string_length,0x11818c);
  }
  else {
    type_00 = (Type *)Typelib::Indirect::getIndirection();
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
    getIDLBase(&local_70,type_00,this->m_exporter,&local_f0);
    std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
      operator_delete(local_70.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((this->m_namespace)._M_string_length == 0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
      getIDLAbsoluteNamespace(&local_70.first,&local_f0,this->m_exporter);
      std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_70.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    Typelib::Container::kind_abi_cxx11_();
    Typelib::getTypename((string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    Typelib::Indirect::getIndirection();
    Typelib::Type::getName_abi_cxx11_();
    local_b0 = (long *)0x11808a;
    pcStack_a8 = "";
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_f0._M_dataplus._M_p + local_f0._M_string_length);
    _Var6._M_p = local_f0._M_dataplus._M_p;
    _Var7._M_current = (char *)paVar1;
    _Var11._M_current = (char *)paVar1;
    sVar3 = local_f0._M_string_length;
    if (local_f0._M_string_length != 0) {
      do {
        sVar9 = 0;
        do {
          sVar10 = sVar9;
          if ((_Var6._M_p[sVar9] != "/"[sVar9]) || (sVar10 = sVar9 + 1, sVar3 - 1 == sVar9)) break;
          bVar12 = sVar9 != 0;
          sVar9 = sVar10;
        } while (bVar12);
        _Var7._M_current = _Var6._M_p;
        _Var11._M_current = (char *)(_Var6._M_p + sVar10);
      } while ((sVar10 != 1) &&
              (_Var6._M_p = _Var6._M_p + 1, _Var7._M_current = (char *)paVar1,
              _Var11._M_current = (char *)paVar1, sVar3 = sVar3 - 1,
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var6._M_p != paVar1));
    }
    if (_Var7._M_current != _Var11._M_current) {
      local_d0 = (long *)0x118219;
      pcStack_c8 = "";
      Finder.m_Search.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      Finder.m_Search.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "/";
      Finder._16_8_ = local_a0;
      FormatResult.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      FormatResult.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "_";
      Formatter.m_Format.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      Formatter.m_Format.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "_";
      FindResult.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_current = _Var11._M_current;
      FindResult.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_current = _Var7._M_current;
      boost::algorithm::detail::
      find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::const_formatF<boost::iterator_range<char_const*>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<char_const*>>
                (&local_f0,Finder,Formatter,FindResult,FormatResult);
    }
    local_b0 = (long *)0x1180ea;
    pcStack_a8 = "";
    _Var7._M_current = local_f0._M_dataplus._M_p + local_f0._M_string_length;
    _Var6._M_p = local_f0._M_dataplus._M_p;
    for (; _Var11._M_current = _Var7._M_current, local_f0._M_string_length != 0;
        local_f0._M_string_length = local_f0._M_string_length - 1) {
      if (*_Var6._M_p == ' ') {
        _Var7._M_current = _Var6._M_p;
        _Var11._M_current = (char *)(_Var6._M_p + 1);
        break;
      }
      _Var6._M_p = _Var6._M_p + 1;
    }
    if (_Var7._M_current != _Var11._M_current) {
      local_d0 = (long *)0x118219;
      pcStack_c8 = "";
      Finder_00.m_Search.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      Finder_00.m_Search.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = " ";
      Finder_00._16_8_ = local_a0;
      FormatResult_00.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      FormatResult_00.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "_";
      Formatter_00.m_Format.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      Formatter_00.m_Format.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "_";
      FindResult_00.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_current = _Var11._M_current;
      FindResult_00.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_current = _Var7._M_current;
      boost::algorithm::detail::
      find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::const_formatF<boost::iterator_range<char_const*>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<char_const*>>
                (&local_f0,Finder_00,Formatter_00,FindResult_00,FormatResult_00);
    }
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_70.first._M_dataplus._M_p,
               local_70.first._M_dataplus._M_p + local_70.first._M_string_length);
    std::__cxx11::string::append((char *)local_90);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_90,(ulong)local_f0._M_dataplus._M_p);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_c0 = *plVar8;
      lStack_b8 = plVar5[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar8;
      local_d0 = (long *)*plVar5;
    }
    pcStack_c8 = (char *)plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_a0 = *plVar8;
      lStack_98 = plVar5[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar8;
      local_b0 = (long *)*plVar5;
    }
    pcStack_a8 = (char *)plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->m_front,(string *)&local_b0);
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_70.first._M_dataplus._M_p);
    }
  }
  return true;
}

Assistant:

bool IDLTypeIdentifierVisitor::visit_(Container const& type)
    {
        if (type.getName() == "/std/string")
        {
            m_namespace = "";
            m_front = "string";
        }
        else
        {
            // Get the basename for "kind"
            m_namespace = getIDLBase(type.getIndirection()).first;
            // We generate all containers in orogen::Corba, even if their
            // element type is a builtin
            if (m_namespace.empty())
                m_namespace = getIDLAbsoluteNamespace("/", m_exporter);

            std::string container_kind = Typelib::getTypename(type.kind());
            std::string element_name   = type.getIndirection().getName();
            boost::replace_all(element_name, Typelib::NamespaceMarkString, "_");
            boost::replace_all(element_name, " ", "_");
            m_front = container_kind + "_" + element_name + "_";
        }

        return true;
    }